

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

int __thiscall QHeaderView::sectionViewportPosition(QHeaderView *this,int logicalIndex)

{
  int iVar1;
  int iVar2;
  QHeaderViewPrivate *this_00;
  QWidgetData *pQVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  
  this_00 = *(QHeaderViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  iVar5 = count(this);
  if (logicalIndex < iVar5) {
    iVar5 = sectionPosition(this,logicalIndex);
    if (-1 < iVar5) {
      iVar5 = iVar5 - this_00->headerOffset;
      bVar4 = QHeaderViewPrivate::reverse(this_00);
      if (bVar4) {
        pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar1 = (pQVar3->crect).x2.m_i;
        iVar2 = (pQVar3->crect).x1.m_i;
        iVar6 = sectionSize(this,logicalIndex);
        iVar5 = (iVar1 - (iVar6 + iVar5 + iVar2)) + 1;
      }
    }
  }
  else {
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int QHeaderView::sectionViewportPosition(int logicalIndex) const
{
    Q_D(const QHeaderView);
    if (logicalIndex >= count())
        return -1;
    int position = sectionPosition(logicalIndex);
    if (position < 0)
        return position; // the section was hidden
    int offsetPosition = position - d->headerOffset;
    if (d->reverse())
        return d->viewport->width() - (offsetPosition + sectionSize(logicalIndex));
    return offsetPosition;
}